

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::Append(SnappyIOVecWriter *this,char *ip,size_t len,char **param_3)

{
  iovec *piVar1;
  ulong __n;
  bool bVar2;
  
  if (this->output_limit_ < this->total_written_ + len) {
    bVar2 = false;
  }
  else {
    bVar2 = len == 0;
    if (!bVar2) {
      bVar2 = false;
      do {
        if (this->curr_iov_remaining_ == 0) {
          piVar1 = this->curr_iov_;
          if (this->output_iov_end_ <= piVar1 + 1) {
            return bVar2;
          }
          this->curr_iov_ = piVar1 + 1;
          this->curr_iov_output_ = (char *)piVar1[1].iov_base;
          this->curr_iov_remaining_ = piVar1[1].iov_len;
        }
        __n = this->curr_iov_remaining_;
        if (len <= this->curr_iov_remaining_) {
          __n = len;
        }
        switchD_00337d4d::default(this->curr_iov_output_,ip,__n);
        this->curr_iov_output_ = this->curr_iov_output_ + __n;
        this->curr_iov_remaining_ = this->curr_iov_remaining_ - __n;
        this->total_written_ = this->total_written_ + __n;
        ip = ip + __n;
        len = len - __n;
        bVar2 = len == 0;
      } while (!bVar2);
    }
  }
  return bVar2;
}

Assistant:

inline bool Append(const char* ip, size_t len, char**) {
    if (total_written_ + len > output_limit_) {
      return false;
    }

    return AppendNoCheck(ip, len);
  }